

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void Js::JavascriptOperators::CallSetter
               (RecyclableObject *function,Var object,Var value,ScriptContext *requestContext)

{
  anon_class_48_6_c5160bac implicitCall;
  ScriptContext *this;
  ThreadContext *this_00;
  ThreadContext *threadContext;
  ScriptContext *scriptContext;
  ScriptContext *requestContext_local;
  Var value_local;
  Var object_local;
  RecyclableObject *function_local;
  
  this = RecyclableObject::GetScriptContext(function);
  this_00 = ScriptContext::GetThreadContext(this);
  implicitCall.scriptContext = this;
  implicitCall.object = object;
  implicitCall.function = function;
  implicitCall.requestContext = requestContext;
  implicitCall.value = value;
  implicitCall.threadContext = this_00;
  ThreadContext::
  ExecuteImplicitCall<Js::JavascriptOperators::CallSetter(Js::RecyclableObject*,void*,void*,Js::ScriptContext*)::__0>
            (this_00,function,ImplicitCall_Accessor,implicitCall);
  return;
}

Assistant:

void JavascriptOperators::CallSetter(RecyclableObject * const function, Var const  object, Var const value, ScriptContext * requestContext)
    {
        ScriptContext * scriptContext = function->GetScriptContext();
        ThreadContext * threadContext = scriptContext->GetThreadContext();
        threadContext->ExecuteImplicitCall(function, ImplicitCall_Accessor, [=]() -> Js::Var
        {
            // Stack object should have a pre-op bail on implicit call.  We shouldn't see them here.
            // Stack numbers are ok, as we will call ToObject to wrap it in a number object anyway
            // See JavascriptOperators::GetThisHelper
            Assert(JavascriptOperators::GetTypeId(object) == TypeIds_Integer ||
                JavascriptOperators::GetTypeId(object) == TypeIds_Number || !ThreadContext::IsOnStack(object));

            // Verify that the scriptcontext is alive before firing getter/setter
            if (!scriptContext->VerifyAlive(!function->IsExternal(), requestContext))
            {
                return nullptr;
            }

            CallFlags flags = CallFlags_Value;
            Var putValue = value;

            // CONSIDER: Have requestContext everywhere, even in the setProperty related codepath.
            if (requestContext)
            {
                putValue = CrossSite::MarshalVar(requestContext, value);
            }

            Var thisVar = RootToThisObject(object, scriptContext);

            RecyclableObject* marshalledFunction = function;
            if (requestContext)
            {
                marshalledFunction = UnsafeVarTo<RecyclableObject>(CrossSite::MarshalVar(requestContext, function, function->GetScriptContext()));
            }

            Var result = CALL_ENTRYPOINT(threadContext, marshalledFunction->GetEntryPoint(), function, CallInfo(flags, 2), thisVar, putValue);
            Assert(result);

            // Set implicit call flags so we bail out if we're trying to propagate the stored value forward. We can't count on the getter/setter
            // to produce the stored value on a LdFld.
            threadContext->AddImplicitCallFlags(ImplicitCall_Accessor);

            return nullptr;
        });
    }